

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void highbd_write_buffer_8xn_avx2
               (__m256i *in,uint16_t *output,int stride,int flipud,int height,int bd)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [32];
  __m256i res;
  __m256i pred;
  undefined4 uVar3;
  undefined8 *puVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int in_R8D;
  undefined8 uVar5;
  undefined8 uVar6;
  longlong lVar7;
  undefined8 uVar8;
  __m128i u1;
  __m256i u;
  __m256i v;
  int i;
  int step;
  __m128i temp;
  int j;
  longlong in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff20;
  int iVar9;
  
  uVar3 = 1;
  if (in_ECX != 0) {
    uVar3 = 0xffffffff;
  }
  for (iVar9 = 0; iVar9 < in_R8D; iVar9 = iVar9 + 1) {
    pauVar1 = (undefined1 (*) [16])(in_RSI + (long)(iVar9 * in_EDX) * 2);
    auVar2 = vpmovsxwd_avx2(*pauVar1);
    uVar5 = auVar2._0_8_;
    uVar6 = auVar2._8_8_;
    lVar7 = auVar2._16_8_;
    uVar8 = auVar2._24_8_;
    pred[1] = in_stack_ffffffffffffff20;
    pred[0] = uVar8;
    pred[2]._0_4_ = iVar9;
    pred[2]._4_4_ = uVar3;
    pred[3] = *(longlong *)*pauVar1;
    res[1] = uVar5;
    res[0] = in_stack_fffffffffffffef8;
    res[2] = uVar6;
    res[3] = lVar7;
    highbd_get_recon_8x8_avx2(pred,res,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    puVar4 = (undefined8 *)(in_RSI + (long)(iVar9 * in_EDX) * 2);
    *puVar4 = uVar5;
    puVar4[1] = uVar6;
    in_stack_fffffffffffffef0 = lVar7;
    in_stack_fffffffffffffef8 = uVar8;
  }
  return;
}

Assistant:

static inline void highbd_write_buffer_8xn_avx2(__m256i *in, uint16_t *output,
                                                int stride, int flipud,
                                                int height, const int bd) {
  int j = flipud ? (height - 1) : 0;
  __m128i temp;
  const int step = flipud ? -1 : 1;
  for (int i = 0; i < height; ++i, j += step) {
    temp = _mm_loadu_si128((__m128i const *)(output + i * stride));
    __m256i v = _mm256_cvtepi16_epi32(temp);
    __m256i u = highbd_get_recon_8x8_avx2(v, in[j], bd);
    __m128i u1 = _mm256_castsi256_si128(u);
    _mm_storeu_si128((__m128i *)(output + i * stride), u1);
  }
}